

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

void Cmd_dump3df(FCommandLine *argv,APlayerPawn *who,int key)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  extsector_t *peVar4;
  F3DFloor *pFVar5;
  secplane_t *psVar6;
  secplane_t *psVar7;
  sector_t *psVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  
  iVar9 = FCommandLine::argc(argv);
  if (1 < iVar9) {
    pcVar10 = FCommandLine::operator[](argv,1);
    lVar11 = strtol(pcVar10,(char **)0x0,10);
    psVar8 = sectors;
    iVar9 = (int)lVar11;
    peVar4 = sectors[iVar9].e;
    if ((peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
      uVar12 = 0;
      do {
        pFVar5 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar12];
        psVar6 = (pFVar5->top).plane;
        dVar1 = psVar8[iVar9].centerspot.X;
        dVar2 = psVar8[iVar9].centerspot.Y;
        psVar7 = (pFVar5->bottom).plane;
        uVar3 = pFVar5->flags;
        pcVar10 = "Exists";
        if ((uVar3 & 1) == 0) {
          pcVar10 = "";
        }
        pcVar13 = "Dynamic";
        if ((uVar3 >> 0x17 & 1) == 0) {
          pcVar13 = "";
        }
        Printf("FFloor %d @ top = %f (model = %d), bottom = %f (model = %d), flags = %B, alpha = %d %s %s\n"
               ,((psVar6->normal).Y * dVar2 + (psVar6->normal).X * dVar1 + psVar6->D) *
                psVar6->negiC,
               (dVar2 * (psVar7->normal).Y + dVar1 * (psVar7->normal).X + psVar7->D) * psVar7->negiC
               ,uVar12 & 0xffffffff,(ulong)(uint)((pFVar5->top).model)->sectornum,
               (ulong)(uint)((pFVar5->bottom).model)->sectornum,(ulong)uVar3,
               (ulong)(uint)pFVar5->alpha,pcVar10,pcVar13);
        uVar12 = uVar12 + 1;
      } while (uVar12 < (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
    }
  }
  return;
}

Assistant:

CCMD (dump3df)
{
	if (argv.argc() > 1) 
	{
		int sec = strtol(argv[1], NULL, 10);
		sector_t *sector = &sectors[sec];
		TArray<F3DFloor*> & ffloors=sector->e->XFloor.ffloors;

		for (unsigned int i = 0; i < ffloors.Size(); i++)
		{
			double height=ffloors[i]->top.plane->ZatPoint(sector->centerspot);
			double bheight=ffloors[i]->bottom.plane->ZatPoint(sector->centerspot);

			IGNORE_FORMAT_PRE
			Printf("FFloor %d @ top = %f (model = %d), bottom = %f (model = %d), flags = %B, alpha = %d %s %s\n", 
				i, height, ffloors[i]->top.model->sectornum, 
				bheight, ffloors[i]->bottom.model->sectornum,
				ffloors[i]->flags, ffloors[i]->alpha, (ffloors[i]->flags&FF_EXISTS)? "Exists":"", (ffloors[i]->flags&FF_DYNAMIC)? "Dynamic":"");
			IGNORE_FORMAT_POST
		}
	}
}